

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VoxWriter.cpp
# Opt level: O0

void __thiscall vox::VoxWriter::StopTimeLogging(VoxWriter *this)

{
  bool bVar1;
  rep rVar2;
  mapped_type_conflict *pmVar3;
  duration<long,_std::ratio<1L,_1000000000L>_> local_38;
  duration<long,_std::ratio<1L,_1000L>_> local_30;
  duration<long,_std::ratio<1L,_1000000000L>_> local_28;
  duration<long,_std::ratio<1L,_1000L>_> local_20;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_18;
  time_point now;
  VoxWriter *this_local;
  
  if ((this->m_TimeLoggingEnabled & 1U) != 0) {
    now.__d.__r = (duration)(duration)this;
    local_18.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    local_28.__r = (rep)std::chrono::operator-(&local_18,&this->m_LastKeyFrameTime);
    local_20.__r = (rep)std::chrono::
                        duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                  (&local_28);
    rVar2 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_20);
    pmVar3 = std::
             map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
             ::operator[](&this->m_FrameTimes,&this->m_KeyFrame);
    *pmVar3 = (double)rVar2 * 0.001;
    bVar1 = std::function::operator_cast_to_bool((function *)&this->m_KeyFrameTimeLoggingFunctor);
    if (bVar1) {
      pmVar3 = std::
               map<unsigned_int,_double,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_double>_>_>
               ::at(&this->m_FrameTimes,&this->m_KeyFrame);
      std::function<void_(const_unsigned_int_&,_const_double_&)>::operator()
                (&this->m_KeyFrameTimeLoggingFunctor,&this->m_KeyFrame,pmVar3);
    }
    local_38.__r = (rep)std::chrono::operator-(&local_18,&this->m_StartTime);
    local_30.__r = (rep)std::chrono::
                        duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                  (&local_38);
    rVar2 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_30);
    this->m_TotalTime = (double)rVar2 * 0.001;
    this->m_TimeLoggingEnabled = false;
  }
  return;
}

Assistant:

void VoxWriter::StopTimeLogging() {
    if (m_TimeLoggingEnabled) {
        const auto now           = std::chrono::steady_clock::now();
        m_FrameTimes[m_KeyFrame] = std::chrono::duration_cast<std::chrono::milliseconds>(now - m_LastKeyFrameTime).count() * 1e-3;
        if (m_KeyFrameTimeLoggingFunctor) {
            m_KeyFrameTimeLoggingFunctor(m_KeyFrame, m_FrameTimes.at(m_KeyFrame));
        }
        m_TotalTime              = std::chrono::duration_cast<std::chrono::milliseconds>(now - m_StartTime).count() * 1e-3;
        m_TimeLoggingEnabled = false;
    }
}